

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::GetIntConstant<int>(InstructionBuilder *this,int value,bool sign)

{
  initializer_list<unsigned_int> __l;
  Type *type;
  IRContext *pIVar1;
  TypeManager *pTVar2;
  ConstantManager *pCVar3;
  Constant *pCVar4;
  allocator<unsigned_int> local_9d;
  uint local_9c;
  iterator local_98;
  size_type local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  Constant *local_70;
  Constant *constant;
  Type *pTStack_60;
  uint32_t word;
  Type *rebuilt_type;
  undefined1 local_50 [4];
  uint32_t type_id;
  Integer int_type;
  bool sign_local;
  int value_local;
  InstructionBuilder *this_local;
  
  int_type._43_1_ = sign;
  int_type._44_4_ = value;
  if ((!sign) && (value < 0)) {
    __assert_fail("value >= 0 && \"Trying to add a signed integer with an unsigned type!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_builder.h"
                  ,0x19d,
                  "Instruction *spvtools::opt::InstructionBuilder::GetIntConstant(T, bool) [T = int]"
                 );
  }
  analysis::Integer::Integer((Integer *)local_50,0x20,sign);
  pIVar1 = GetContext(this);
  pTVar2 = IRContext::get_type_mgr(pIVar1);
  rebuilt_type._4_4_ = analysis::TypeManager::GetTypeInstruction(pTVar2,(Type *)local_50);
  if (rebuilt_type._4_4_ == 0) {
    this_local = (InstructionBuilder *)0x0;
  }
  else {
    pIVar1 = GetContext(this);
    pTVar2 = IRContext::get_type_mgr(pIVar1);
    pTStack_60 = analysis::TypeManager::GetType(pTVar2,rebuilt_type._4_4_);
    constant._4_4_ = int_type._44_4_;
    pIVar1 = GetContext(this);
    pCVar3 = IRContext::get_constant_mgr(pIVar1);
    type = pTStack_60;
    local_9c = constant._4_4_;
    local_98 = &local_9c;
    local_90 = 1;
    std::allocator<unsigned_int>::allocator(&local_9d);
    __l._M_len = local_90;
    __l._M_array = local_98;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_88,__l,&local_9d);
    pCVar4 = analysis::ConstantManager::GetConstant(pCVar3,type,&local_88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
    std::allocator<unsigned_int>::~allocator(&local_9d);
    local_70 = pCVar4;
    pIVar1 = GetContext(this);
    pCVar3 = IRContext::get_constant_mgr(pIVar1);
    this_local = (InstructionBuilder *)
                 analysis::ConstantManager::GetDefiningInstruction
                           (pCVar3,local_70,0,(inst_iterator *)0x0);
  }
  rebuilt_type._0_4_ = 1;
  analysis::Integer::~Integer((Integer *)local_50);
  return (Instruction *)this_local;
}

Assistant:

Instruction* GetIntConstant(T value, bool sign) {
    // Assert that we are not trying to store a negative number in an unsigned
    // type.
    if (!sign)
      assert(value >= 0 &&
             "Trying to add a signed integer with an unsigned type!");

    analysis::Integer int_type{32, sign};

    // Get or create the integer type. This rebuilds the type and manages the
    // memory for the rebuilt type.
    uint32_t type_id =
        GetContext()->get_type_mgr()->GetTypeInstruction(&int_type);

    if (type_id == 0) {
      return nullptr;
    }

    // Get the memory managed type so that it is safe to be stored by
    // GetConstant.
    analysis::Type* rebuilt_type =
        GetContext()->get_type_mgr()->GetType(type_id);

    // Even if the value is negative we need to pass the bit pattern as a
    // uint32_t to GetConstant.
    uint32_t word = value;

    // Create the constant value.
    const analysis::Constant* constant =
        GetContext()->get_constant_mgr()->GetConstant(rebuilt_type, {word});

    // Create the OpConstant instruction using the type and the value.
    return GetContext()->get_constant_mgr()->GetDefiningInstruction(constant);
  }